

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::FreeColSingletonPS
          (FreeColSingletonPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *simplifier,int _j,int _i,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *slackVal,shared_ptr<soplex::Tolerances> *tols)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  uint *puVar1;
  pointer pnVar2;
  pointer pnVar3;
  bool bVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_158;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_158,&tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  PostStep::PostStep(&this->super_PostStep,"FreeColSingleton",
                     (shared_ptr<soplex::Tolerances> *)&local_158,
                     (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum,
                     (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeColSingletonPS_00542850;
  this->m_j = _j;
  this->m_i = _i;
  this->m_old_j =
       (lp->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  this->m_old_i =
       (lp->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .set.thenum + -1;
  this_00 = &this->m_obj;
  if (lp->thesense == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(this_00,lp,_j);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_298,lp,_j);
    *(ulong *)((this->m_obj).m_backend.data._M_elems + 8) =
         CONCAT35(local_298.data._M_elems[9]._1_3_,local_298.data._M_elems._32_5_);
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4) = local_298.data._M_elems._16_8_;
    *(ulong *)((this->m_obj).m_backend.data._M_elems + 6) =
         CONCAT35(local_298.data._M_elems[7]._1_3_,local_298.data._M_elems._24_5_);
    *(undefined8 *)(this_00->m_backend).data._M_elems = local_298.data._M_elems._0_8_;
    *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2) = local_298.data._M_elems._8_8_;
    (this->m_obj).m_backend.exp = local_298.exp;
    (this->m_obj).m_backend.neg = local_298.neg;
    (this->m_obj).m_backend.fpclass = local_298.fpclass;
    (this->m_obj).m_backend.prec_elem = local_298.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(&this_00->m_backend);
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->m_lRhs).m_backend,&slackVal->m_backend);
  local_198.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((slackVal->m_backend).data._M_elems + 8);
  local_198.m_backend.data._M_elems._0_8_ = *(undefined8 *)(slackVal->m_backend).data._M_elems;
  local_198.m_backend.data._M_elems._8_8_ = *(undefined8 *)((slackVal->m_backend).data._M_elems + 2)
  ;
  local_198.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((slackVal->m_backend).data._M_elems + 4);
  local_198.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((slackVal->m_backend).data._M_elems + 6);
  local_198.m_backend.exp = (slackVal->m_backend).exp;
  local_198.m_backend.neg = (slackVal->m_backend).neg;
  local_198.m_backend.fpclass = (slackVal->m_backend).fpclass;
  local_198.m_backend.prec_elem = (slackVal->m_backend).prec_elem;
  pnVar2 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar2[_i].m_backend.data._M_elems + 8)
  ;
  pnVar3 = pnVar2 + _i;
  local_1d8.m_backend.data._M_elems[0] = (pnVar3->m_backend).data._M_elems[0];
  local_1d8.m_backend.data._M_elems[1] = (pnVar3->m_backend).data._M_elems[1];
  local_1d8.m_backend.data._M_elems[2] = (pnVar3->m_backend).data._M_elems[2];
  local_1d8.m_backend.data._M_elems[3] = (pnVar3->m_backend).data._M_elems[3];
  puVar1 = pnVar2[_i].m_backend.data._M_elems + 4;
  local_1d8.m_backend.data._M_elems[4] = *puVar1;
  local_1d8.m_backend.data._M_elems[5] = puVar1[1];
  local_1d8.m_backend.data._M_elems[6] = puVar1[2];
  local_1d8.m_backend.data._M_elems[7] = puVar1[3];
  local_1d8.m_backend.exp = pnVar2[_i].m_backend.exp;
  local_1d8.m_backend.neg = pnVar2[_i].m_backend.neg;
  local_1d8.m_backend.fpclass = pnVar2[_i].m_backend.fpclass;
  local_1d8.m_backend.prec_elem = pnVar2[_i].m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_68,this);
  bVar4 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_198,&local_1d8,&local_68);
  this->m_onLhs = bVar4;
  pnVar3 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar3[_i].m_backend.data._M_elems + 8)
  ;
  local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[_i].m_backend.data;
  local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pnVar3[_i].m_backend.data._M_elems + 2);
  puVar1 = pnVar3[_i].m_backend.data._M_elems + 4;
  local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_218.m_backend.exp = pnVar3[_i].m_backend.exp;
  local_218.m_backend.neg = pnVar3[_i].m_backend.neg;
  local_218.m_backend.fpclass = pnVar3[_i].m_backend.fpclass;
  local_218.m_backend.prec_elem = pnVar3[_i].m_backend.prec_elem;
  pnVar2 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_258.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pnVar2[_i].m_backend.data._M_elems + 8)
  ;
  pnVar3 = pnVar2 + _i;
  local_258.m_backend.data._M_elems[0] = (pnVar3->m_backend).data._M_elems[0];
  local_258.m_backend.data._M_elems[1] = (pnVar3->m_backend).data._M_elems[1];
  local_258.m_backend.data._M_elems[2] = (pnVar3->m_backend).data._M_elems[2];
  local_258.m_backend.data._M_elems[3] = (pnVar3->m_backend).data._M_elems[3];
  puVar1 = pnVar2[_i].m_backend.data._M_elems + 4;
  local_258.m_backend.data._M_elems[4] = *puVar1;
  local_258.m_backend.data._M_elems[5] = puVar1[1];
  local_258.m_backend.data._M_elems[6] = puVar1[2];
  local_258.m_backend.data._M_elems[7] = puVar1[3];
  local_258.m_backend.exp = pnVar2[_i].m_backend.exp;
  local_258.m_backend.neg = pnVar2[_i].m_backend.neg;
  local_258.m_backend.fpclass = pnVar2[_i].m_backend.fpclass;
  local_258.m_backend.prec_elem = pnVar2[_i].m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
  bVar4 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_218,&local_258,&local_a0);
  this->m_eqCons = bVar4;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->m_row,
             (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)((lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem +
                (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[_i].idx));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)&local_d8,lp,this->m_j);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_110,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  local_298.fpclass = cpp_dec_float_finite;
  local_298.prec_elem = 10;
  local_298.data._M_elems[0] = 0;
  local_298.data._M_elems[1] = 0;
  local_298.data._M_elems[2] = 0;
  local_298.data._M_elems[3] = 0;
  local_298.data._M_elems[4] = 0;
  local_298.data._M_elems[5] = 0;
  local_298.data._M_elems._24_5_ = 0;
  local_298.data._M_elems[7]._1_3_ = 0;
  local_298.data._M_elems._32_5_ = 0;
  local_298.data._M_elems[9]._1_3_ = 0;
  local_298.exp = 0;
  local_298.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_298,&local_d8,&local_110);
  local_148.fpclass = cpp_dec_float_finite;
  local_148.prec_elem = 10;
  local_148.data._M_elems[0] = 0;
  local_148.data._M_elems[1] = 0;
  local_148.data._M_elems[2] = 0;
  local_148.data._M_elems[3] = 0;
  local_148.data._M_elems[4] = 0;
  local_148.data._M_elems[5] = 0;
  local_148.data._M_elems._24_5_ = 0;
  local_148.data._M_elems[7]._1_3_ = 0;
  local_148.data._M_elems._32_5_ = 0;
  local_148._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_148,&(this->m_lRhs).m_backend,&local_298);
  (*(simplifier->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxSimplifier[0x11])(simplifier,&local_148);
  return;
}

Assistant:

FreeColSingletonPS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _j, int _i,
                         R slackVal, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeColSingleton", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_i(_i)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_lRhs(slackVal)
         , m_onLhs(EQ(slackVal, lp.lhs(_i), this->epsilon()))
         , m_eqCons(EQ(lp.lhs(_i), lp.rhs(_i), this->epsilon()))
         , m_row(lp.rowVector(_i))
      {
         assert(m_row[m_j] != 0.0);
         simplifier.addObjoffset(m_lRhs * (lp.obj(m_j) / m_row[m_j]));
      }